

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_PlaneEquation::Transform(ON_PlaneEquation *this,ON_Xform *xform)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  bool bVar5;
  long lVar6;
  ON_Xform *pOVar7;
  byte bVar8;
  ON_Xform T;
  
  bVar8 = 0;
  bVar5 = IsValid(this);
  if (bVar5) {
    pOVar7 = &T;
    for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(double *)pOVar7 = xform->m_xform[0][0];
      xform = (ON_Xform *)((long)xform + ((ulong)bVar8 * -2 + 1) * 8);
      pOVar7 = (ON_Xform *)((long)pOVar7 + ((ulong)bVar8 * -2 + 1) * 8);
    }
    bVar5 = ON_Xform::Invert(&T,(double *)0x0);
    if (bVar5) {
      dVar2 = this->x;
      dVar3 = this->y;
      dVar4 = this->z;
      dVar1 = this->d;
      this->x = T.m_xform[3][0] * dVar1 +
                T.m_xform[2][0] * dVar4 + T.m_xform[0][0] * dVar2 + T.m_xform[1][0] * dVar3;
      this->y = T.m_xform[3][1] * dVar1 +
                T.m_xform[2][1] * dVar4 + T.m_xform[0][1] * dVar2 + T.m_xform[1][1] * dVar3;
      this->z = dVar1 * T.m_xform[3][2] +
                dVar4 * T.m_xform[2][2] + dVar2 * T.m_xform[0][2] + dVar3 * T.m_xform[1][2];
      this->d = dVar1 * T.m_xform[3][3] +
                dVar4 * T.m_xform[2][3] + dVar2 * T.m_xform[0][3] + dVar3 * T.m_xform[1][3];
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_PlaneEquation::Transform( const ON_Xform& xform )
{
  bool rc = IsValid();
  if ( rc )
  {
    // Apply the inverse transpose to the equation parameters
    ON_Xform T(xform);
    rc = T.Invert();
    if ( rc )
    {
      const double xx=x;
      const double yy=y;
      const double zz=z;
      const double dd=d;
      x = T.m_xform[0][0]*xx + T.m_xform[1][0]*yy + T.m_xform[2][0]*zz + T.m_xform[3][0]*dd;
      y = T.m_xform[0][1]*xx + T.m_xform[1][1]*yy + T.m_xform[2][1]*zz + T.m_xform[3][1]*dd;
      z = T.m_xform[0][2]*xx + T.m_xform[1][2]*yy + T.m_xform[2][2]*zz + T.m_xform[3][2]*dd;
      d = T.m_xform[0][3]*xx + T.m_xform[1][3]*yy + T.m_xform[2][3]*zz + T.m_xform[3][3]*dd;
    }
  }
  return rc;
}